

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O0

lyd_diff_userord *
lyd_diff_userord_get(lyd_node *first,lysc_node *schema,lyd_diff_userord **userord)

{
  lyd_node *siblings;
  lyd_node **__s;
  bool bVar1;
  lyd_node **local_68;
  undefined8 *local_58;
  char *p___1;
  char *p__;
  uint64_t u;
  lyd_node **node;
  lyd_node *iter;
  lyd_diff_userord *item;
  lyd_diff_userord **userord_local;
  lysc_node *schema_local;
  lyd_node *first_local;
  
  p__ = (char *)0x0;
  while( true ) {
    if (*userord == (lyd_diff_userord *)0x0) {
      local_68 = (lyd_node **)0x0;
    }
    else {
      local_68 = (*userord)[-1].inst;
    }
    if (local_68 <= p__) break;
    if ((*userord)[(long)p__].schema == schema) {
      return *userord + (long)p__;
    }
    p__ = p__ + 1;
  }
  item = (lyd_diff_userord *)userord;
  userord_local = (lyd_diff_userord **)schema;
  schema_local = (lysc_node *)first;
  if (*userord == (lyd_diff_userord *)0x0) {
    p___1 = (char *)malloc(0x20);
    if (p___1 == (char *)0x0) {
      ly_log((ly_ctx *)userord_local[1]->schema,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_diff_userord_get");
      return (lyd_diff_userord *)0x0;
    }
    p___1[0] = '\x01';
    p___1[1] = '\0';
    p___1[2] = '\0';
    p___1[3] = '\0';
    p___1[4] = '\0';
    p___1[5] = '\0';
    p___1[6] = '\0';
    p___1[7] = '\0';
  }
  else {
    (*userord)[-1].inst = (lyd_node **)((long)(*userord)[-1].inst + 1);
    p___1 = (char *)realloc(&(*userord)[-1].inst,(long)(*userord)[-1].inst * 0x18 + 8);
    if (p___1 == (char *)0x0) {
      item->schema[-1].priv = (void *)((long)item->schema[-1].priv + -1);
      ly_log((ly_ctx *)userord_local[1]->schema,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_diff_userord_get");
      return (lyd_diff_userord *)0x0;
    }
  }
  item->schema = (lysc_node *)(p___1 + 8);
  iter = (lyd_node *)(item->schema->hash + (long)item->schema[-1].priv * 0x18 + -0x1c);
  memset(iter,0,0x18);
  *(lyd_diff_userord ***)iter = userord_local;
  iter->schema = (lysc_node *)0x0;
  iter->parent = (lyd_node_inner *)0x0;
  if (schema_local != (lysc_node *)0x0) {
    siblings = lyd_first_sibling((lyd_node *)schema_local);
    lyd_find_sibling_val
              (siblings,(lysc_node *)schema_local->module,(char *)0x0,0,(lyd_node **)&node);
    while( true ) {
      bVar1 = false;
      if (node != (lyd_node **)0x0) {
        bVar1 = (lys_module *)node[1] == schema_local->module;
      }
      if (!bVar1) break;
      if (iter->parent == (lyd_node_inner *)0x0) {
        local_58 = (undefined8 *)malloc(0x10);
        if (local_58 == (undefined8 *)0x0) {
          ly_log((ly_ctx *)userord_local[1]->schema,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lyd_diff_userord_get");
          return (lyd_diff_userord *)0x0;
        }
        *local_58 = 1;
      }
      else {
        iter->parent[-1].children_ht = (ly_ht *)((long)&(iter->parent[-1].children_ht)->used + 1);
        local_58 = (undefined8 *)
                   realloc(&iter->parent[-1].children_ht,(long)iter->parent[-1].children_ht * 8 + 8)
        ;
        if (local_58 == (undefined8 *)0x0) {
          iter->parent[-1].children_ht = (ly_ht *)((long)&iter->parent[-1].children_ht[-1].recs + 7)
          ;
          ly_log((ly_ctx *)userord_local[1]->schema,LY_LLERR,LY_EMEM,
                 "Memory allocation failed (%s()).","lyd_diff_userord_get");
          return (lyd_diff_userord *)0x0;
        }
      }
      iter->parent = (lyd_node_inner *)(local_58 + 1);
      __s = &iter->parent->child + (long)&iter->parent[-1].children_ht[-1].recs;
      memset(__s,0,8);
      *__s = (lyd_node *)node;
      node = (lyd_node **)node[3];
    }
  }
  return (lyd_diff_userord *)iter;
}

Assistant:

static struct lyd_diff_userord *
lyd_diff_userord_get(const struct lyd_node *first, const struct lysc_node *schema, struct lyd_diff_userord **userord)
{
    struct lyd_diff_userord *item;
    struct lyd_node *iter;
    const struct lyd_node **node;
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(*userord, u) {
        if ((*userord)[u].schema == schema) {
            return &(*userord)[u];
        }
    }

    /* it was not added yet, add it now */
    LY_ARRAY_NEW_RET(schema->module->ctx, *userord, item, NULL);

    item->schema = schema;
    item->pos = 0;
    item->inst = NULL;

    /* store all the instance pointers in the current order */
    if (first) {
        LYD_LIST_FOR_INST(lyd_first_sibling(first), first->schema, iter) {
            LY_ARRAY_NEW_RET(schema->module->ctx, item->inst, node, NULL);
            *node = iter;
        }
    }

    return item;
}